

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node_struct *
pugi::impl::anon_unknown_0::append_new_node
          (xml_node_struct *node,xml_allocator *alloc,xml_node_type type)

{
  bool bVar1;
  xml_allocator *in_RSI;
  xml_node_struct *in_RDI;
  xml_node_struct *child;
  xml_allocator *in_stack_fffffffffffffff8;
  xml_node_struct *child_00;
  
  bVar1 = xml_allocator::reserve(in_RSI);
  if (bVar1) {
    child_00 = allocate_node(in_stack_fffffffffffffff8,(xml_node_type)((ulong)in_RDI >> 0x20));
    if (child_00 == (xml_node_struct *)0x0) {
      child_00 = (xml_node_struct *)0x0;
    }
    else {
      append_node(child_00,in_RDI);
    }
  }
  else {
    child_00 = (xml_node_struct *)0x0;
  }
  return child_00;
}

Assistant:

PUGI_IMPL_FN_NO_INLINE xml_node_struct* append_new_node(xml_node_struct* node, xml_allocator& alloc, xml_node_type type = node_element)
	{
		if (!alloc.reserve()) return NULL;

		xml_node_struct* child = allocate_node(alloc, type);
		if (!child) return NULL;

		append_node(child, node);

		return child;
	}